

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_euler_jac(REF_DBL *state,REF_DBL *direction,REF_DBL *dflux_dcons)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = direction[2];
  dVar2 = state[3];
  dVar12 = dVar2 * -0.3999999999999999;
  dVar3 = state[1];
  dVar4 = state[2];
  dVar13 = dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4;
  dVar11 = (*state * 0.5 * dVar13 + state[4] / 0.3999999999999999 + state[4]) / *state;
  dVar13 = dVar13 * 0.19999999999999996;
  dVar16 = dVar3 * -0.3999999999999999;
  dVar14 = dVar4 * -0.3999999999999999;
  dVar5 = *direction;
  dVar6 = direction[1];
  dVar15 = dVar3 * dVar5 + dVar4 * dVar6 + dVar2 * dVar1;
  dVar7 = direction[1];
  dVar8 = direction[2];
  dVar9 = state[2];
  dVar10 = state[3];
  *dflux_dcons = 0.0;
  dflux_dcons[1] = dVar13 * dVar5 - dVar15 * dVar3;
  dflux_dcons[2] = dVar13 * dVar6 - dVar15 * dVar4;
  dflux_dcons[3] = dVar13 * dVar1 - dVar15 * dVar2;
  dflux_dcons[4] = (dVar13 - dVar11) * dVar15;
  dflux_dcons[5] = dVar5;
  dflux_dcons[6] = dVar5 * dVar16 + dVar3 * dVar5 + dVar15;
  dflux_dcons[7] = dVar5 * dVar9 + dVar16 * dVar7;
  dflux_dcons[8] = dVar5 * dVar10 + dVar16 * dVar8;
  dflux_dcons[9] = dVar11 * dVar5 + dVar16 * dVar15;
  dflux_dcons[10] = dVar6;
  dflux_dcons[0xb] = dVar3 * dVar6 + dVar5 * dVar14;
  dflux_dcons[0xc] = dVar6 * dVar14 + dVar4 * dVar6 + dVar15;
  dflux_dcons[0xd] = dVar2 * dVar6 + dVar14 * dVar1;
  dflux_dcons[0xe] = dVar11 * dVar6 + dVar14 * dVar15;
  dflux_dcons[0xf] = dVar1;
  dflux_dcons[0x10] = dVar1 * dVar3 + dVar12 * dVar5;
  dflux_dcons[0x11] = dVar1 * dVar4 + dVar12 * dVar6;
  dflux_dcons[0x12] = dVar1 * dVar12 + dVar2 * dVar1 + dVar15;
  dflux_dcons[0x13] = dVar15 * dVar12 + dVar11 * dVar1;
  dflux_dcons[0x14] = 0.0;
  dflux_dcons[0x15] = dVar5 * 0.3999999999999999;
  dflux_dcons[0x16] = dVar6 * 0.3999999999999999;
  dflux_dcons[0x17] = dVar1 * 0.3999999999999999;
  dflux_dcons[0x18] = dVar15 * 1.4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_euler_jac(REF_DBL *state, REF_DBL *direction,
                                      REF_DBL *dflux_dcons) {
  REF_DBL rho, u, v, w, p, q2, e, qn;
  REF_DBL gamma = 1.4;
  REF_DBL K, H;
  REF_DBL nx, ny, nz;
  nx = direction[0];
  ny = direction[1];
  nz = direction[2];

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];

  K = gamma - 1;
  q2 = (u * u + v * v + w * w);
  e = p / K + 0.5 * rho * q2;
  H = (e + p) / rho;

  qn = u * nx + v * ny + w * nz;

  dflux_dcons[0 + 0 * 5] = 0.0;
  dflux_dcons[1 + 0 * 5] = 0.5 * K * q2 * nx - u * qn;
  dflux_dcons[2 + 0 * 5] = 0.5 * K * q2 * ny - v * qn;
  dflux_dcons[3 + 0 * 5] = 0.5 * K * q2 * nz - w * qn;
  dflux_dcons[4 + 0 * 5] = (0.5 * K * q2 - H) * qn;

  dflux_dcons[0 + 1 * 5] = nx;
  dflux_dcons[1 + 1 * 5] = u * nx - K * u * nx + qn;
  dflux_dcons[2 + 1 * 5] = v * nx - K * u * ny;
  dflux_dcons[3 + 1 * 5] = w * nx - K * u * nz;
  dflux_dcons[4 + 1 * 5] = H * nx - K * u * qn;

  dflux_dcons[0 + 2 * 5] = ny;
  dflux_dcons[1 + 2 * 5] = u * ny - K * v * nx;
  dflux_dcons[2 + 2 * 5] = v * ny - K * v * ny + qn;
  dflux_dcons[3 + 2 * 5] = w * ny - K * v * nz;
  dflux_dcons[4 + 2 * 5] = H * ny - K * v * qn;

  dflux_dcons[0 + 3 * 5] = nz;
  dflux_dcons[1 + 3 * 5] = u * nz - K * w * nx;
  dflux_dcons[2 + 3 * 5] = v * nz - K * w * ny;
  dflux_dcons[3 + 3 * 5] = w * nz - K * w * nz + qn;
  dflux_dcons[4 + 3 * 5] = H * nz - K * w * qn;

  dflux_dcons[0 + 4 * 5] = 0;
  dflux_dcons[1 + 4 * 5] = K * nx;
  dflux_dcons[2 + 4 * 5] = K * ny;
  dflux_dcons[3 + 4 * 5] = K * nz;
  dflux_dcons[4 + 4 * 5] = gamma * qn;

  return REF_SUCCESS;
}